

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O0

bool __thiscall
cmProjectCommand::InitialPass
          (cmProjectCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  const_reference p;
  char *pcVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  reference name;
  ulong uVar7;
  ostream *poVar8;
  PolicyID id;
  bool local_ba9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  allocator<char> local_ad1;
  string local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  allocator<char> local_a89;
  string local_a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  allocator<char> local_a41;
  string local_a40;
  string local_a20;
  string local_a00;
  undefined1 local_9e0 [8];
  ostringstream w;
  char *v_1;
  string *i_2;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string vw;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  undefined1 local_780 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vv_1;
  string local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  allocator<char> local_719;
  string local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  allocator<char> local_689;
  string local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  allocator<char> local_641;
  string local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  undefined1 local_600 [8];
  string vv;
  int i_1;
  int vc;
  uint v [4];
  char vb [4] [64];
  char *local_4c0;
  char *sep;
  string vs;
  undefined1 local_478 [8];
  string e;
  RegularExpression vx;
  string local_380;
  PolicyStatus local_360;
  allocator<char> local_359;
  PolicyStatus cmp0048;
  anon_class_16_2_0515cf3d local_338;
  allocator<char> local_321;
  string local_320;
  anon_class_16_2_0515cf3d local_300;
  allocator<char> local_2e9;
  string local_2e8;
  anon_class_16_2_0515cf3d local_2c8;
  allocator<char> local_2b1;
  string local_2b0;
  string local_290;
  allocator<char> local_269;
  undefined1 local_268 [8];
  string msg;
  string local_240;
  ulong local_220;
  size_t i;
  anon_class_8_1_0e9793f7 aStack_210;
  Doing doing;
  anon_class_8_1_0e9793f7 resetReporter;
  function<void_()> missedValueReporter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string homepage;
  string description;
  string version;
  undefined1 local_168 [2];
  bool injectedProjectCommand;
  bool haveHomepage;
  bool haveDescription;
  bool haveLanguages;
  bool haveVersion;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  string srcdir;
  string bindir;
  string *projectName;
  string local_80;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_7_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmProjectCommand *this_local;
  
  local_28 = param_2;
  param_7_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"PROJECT called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_00276b2f;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_PROJECT_INCLUDE_BEFORE",
             (allocator<char> *)((long)&projectName + 7));
  bVar2 = IncludeByVariable(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&projectName + 7));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    this_local._7_1_ = 0;
    goto LAB_00276b2f;
  }
  p = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_7_local,0);
  cmMakefile::SetProjectName((this->super_cmCommand).Makefile,p);
  std::__cxx11::string::string((string *)(srcdir.field_2._M_local_buf + 8),(string *)p);
  std::__cxx11::string::operator+=((string *)(srcdir.field_2._M_local_buf + 8),"_BINARY_DIR");
  std::__cxx11::string::string((string *)local_d0,(string *)p);
  std::__cxx11::string::operator+=((string *)local_d0,"_SOURCE_DIR");
  pcVar1 = (this->super_cmCommand).Makefile;
  cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddCacheDefinition
            (pcVar1,(string *)((long)&srcdir.field_2 + 8),pcVar3,"Value Computed by CMake",STATIC,
             false);
  pcVar1 = (this->super_cmCommand).Makefile;
  cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddCacheDefinition
            (pcVar1,(string *)local_d0,pcVar3,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::operator=((string *)(srcdir.field_2._M_local_buf + 8),"PROJECT_BINARY_DIR");
  std::__cxx11::string::operator=((string *)local_d0,"PROJECT_SOURCE_DIR");
  pcVar1 = (this->super_cmCommand).Makefile;
  cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,(string *)((long)&srcdir.field_2 + 8),pcVar3);
  pcVar1 = (this->super_cmCommand).Makefile;
  cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,(string *)local_d0,pcVar3);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"PROJECT_NAME",&local_f1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,&local_f0,pcVar3);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CMAKE_PROJECT_NAME",&local_119);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_118);
  local_ba9 = true;
  if (pcVar3 != (char *)0x0) {
    local_ba9 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
  }
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  if (local_ba9 != false) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"CMAKE_PROJECT_NAME",&local_141);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,&local_140,pcVar3);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_168,"CMAKE_PROJECT_NAME",
               (allocator<char> *)(version.field_2._M_local_buf + 0xf));
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition
              (pcVar1,(string *)local_168,pcVar3,"Value Computed by CMake",STATIC,false);
    std::__cxx11::string::~string((string *)local_168);
    std::allocator<char>::~allocator((allocator<char> *)(version.field_2._M_local_buf + 0xf));
  }
  version.field_2._M_local_buf[0xe] = '\0';
  version.field_2._M_local_buf[0xd] = '\0';
  version.field_2._M_local_buf[0xc] = '\0';
  version.field_2._M_local_buf[0xb] = '\0';
  version.field_2._M_local_buf[10] = '\0';
  std::__cxx11::string::string((string *)(description.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(homepage.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &languages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&missedValueReporter._M_invoker);
  std::function<void_()>::function((function<void_()> *)&resetReporter);
  aStack_210.missedValueReporter = (function<void_()> *)&resetReporter;
  i._4_4_ = 2;
  for (local_220 = 1; uVar7 = local_220,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_7_local), uVar7 < sVar4; local_220 = local_220 + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_7_local,local_220);
    bVar2 = std::operator==(pvVar5,"LANGUAGES");
    if (bVar2) {
      if ((version.field_2._M_local_buf[0xd] & 1U) != 0) {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,"LANGUAGES may be specified at most once.",
                   (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = 1;
        msg.field_2._8_4_ = 1;
        goto LAB_00276a83;
      }
      version.field_2._M_local_buf[0xd] = '\x01';
      bVar2 = std::function::operator_cast_to_bool((function *)&resetReporter);
      if (bVar2) {
        std::function<void_()>::operator()((function<void_()> *)&resetReporter);
      }
      i._4_4_ = 2;
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&missedValueReporter._M_invoker);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_268,
                   "the following parameters must be specified after LANGUAGES keyword: ",&local_269
                  );
        std::allocator<char>::~allocator(&local_269);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_290,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&missedValueReporter._M_invoker,", ");
        std::__cxx11::string::operator+=((string *)local_268,(string *)&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::operator+=((string *)local_268,'.');
        cmMakefile::IssueMessage((this->super_cmCommand).Makefile,WARNING,(string *)local_268);
        std::__cxx11::string::~string((string *)local_268);
      }
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_7_local,local_220);
      bVar2 = std::operator==(pvVar5,"VERSION");
      if (bVar2) {
        if ((version.field_2._M_local_buf[0xe] & 1U) != 0) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b0,"VERSION may be specified at most once.",&local_2b1);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2b0);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::allocator<char>::~allocator(&local_2b1);
          cmSystemTools::SetFatalErrorOccured();
          this_local._7_1_ = 1;
          msg.field_2._8_4_ = 1;
          goto LAB_00276a83;
        }
        version.field_2._M_local_buf[0xe] = '\x01';
        bVar2 = std::function::operator_cast_to_bool((function *)&resetReporter);
        if (bVar2) {
          std::function<void_()>::operator()((function<void_()> *)&resetReporter);
        }
        i._4_4_ = 3;
        local_2c8.resetReporter = &stack0xfffffffffffffdf0;
        local_2c8.this = this;
        std::function<void()>::operator=((function<void()> *)&resetReporter,&local_2c8);
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_7_local,local_220);
        bVar2 = std::operator==(pvVar5,"DESCRIPTION");
        if (bVar2) {
          if ((version.field_2._M_local_buf[0xc] & 1U) != 0) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2e8,"DESCRIPTION may be specified at most once.",&local_2e9)
            ;
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2e8);
            std::__cxx11::string::~string((string *)&local_2e8);
            std::allocator<char>::~allocator(&local_2e9);
            cmSystemTools::SetFatalErrorOccured();
            this_local._7_1_ = 1;
            msg.field_2._8_4_ = 1;
            goto LAB_00276a83;
          }
          version.field_2._M_local_buf[0xc] = '\x01';
          bVar2 = std::function::operator_cast_to_bool((function *)&resetReporter);
          if (bVar2) {
            std::function<void_()>::operator()((function<void_()> *)&resetReporter);
          }
          i._4_4_ = 0;
          local_300.resetReporter = &stack0xfffffffffffffdf0;
          local_300.this = this;
          std::function<void()>::operator=((function<void()> *)&resetReporter,&local_300);
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_7_local,local_220);
          bVar2 = std::operator==(pvVar5,"HOMEPAGE_URL");
          if (bVar2) {
            if ((version.field_2._M_local_buf[0xb] & 1U) != 0) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_320,"HOMEPAGE_URL may be specified at most once.",
                         &local_321);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_320);
              std::__cxx11::string::~string((string *)&local_320);
              std::allocator<char>::~allocator(&local_321);
              cmSystemTools::SetFatalErrorOccured();
              this_local._7_1_ = 1;
              msg.field_2._8_4_ = 1;
              goto LAB_00276a83;
            }
            version.field_2._M_local_buf[0xb] = '\x01';
            i._4_4_ = 1;
            local_338.resetReporter = &stack0xfffffffffffffdf0;
            local_338.this = this;
            std::function<void()>::operator=((function<void()> *)&resetReporter,&local_338);
          }
          else {
            if (local_220 == 1) {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_7_local,1);
              bVar2 = std::operator==(pvVar5,"__CMAKE_INJECTED_PROJECT_COMMAND__");
              if (bVar2) {
                version.field_2._M_local_buf[10] = '\x01';
                goto LAB_002754e4;
              }
            }
            if (i._4_4_ == 3) {
              i._4_4_ = 2;
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_7_local,local_220);
              std::__cxx11::string::operator=
                        ((string *)(description.field_2._M_local_buf + 8),(string *)pvVar5);
              InitialPass::anon_class_8_1_0e9793f7::operator()(&stack0xfffffffffffffdf0);
            }
            else if (i._4_4_ == 0) {
              i._4_4_ = 2;
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_7_local,local_220);
              std::__cxx11::string::operator=
                        ((string *)(homepage.field_2._M_local_buf + 8),(string *)pvVar5);
              InitialPass::anon_class_8_1_0e9793f7::operator()(&stack0xfffffffffffffdf0);
            }
            else if (i._4_4_ == 1) {
              i._4_4_ = 2;
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_7_local,local_220);
              std::__cxx11::string::operator=
                        ((string *)
                         &languages.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar5);
              InitialPass::anon_class_8_1_0e9793f7::operator()(&stack0xfffffffffffffdf0);
            }
            else {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_7_local,local_220);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&missedValueReporter._M_invoker,pvVar5);
            }
          }
        }
      }
    }
LAB_002754e4:
  }
  bVar2 = std::function::operator_cast_to_bool((function *)&resetReporter);
  if (bVar2) {
    std::function<void_()>::operator()((function<void_()> *)&resetReporter);
  }
  if (((((version.field_2._M_local_buf[0xe] & 1U) == 0) &&
       ((version.field_2._M_local_buf[0xc] & 1U) == 0)) &&
      ((version.field_2._M_local_buf[0xb] & 1U) == 0)) ||
     (((version.field_2._M_local_buf[0xd] & 1U) != 0 ||
      (bVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&missedValueReporter._M_invoker), bVar2)))) {
    if (((version.field_2._M_local_buf[0xd] & 1U) != 0) &&
       (bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&missedValueReporter._M_invoker), bVar2)) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[5]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &missedValueReporter._M_invoker,(char (*) [5])0x871411);
    }
    local_360 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0048,false);
    if ((version.field_2._M_local_buf[0xe] & 1U) == 0) {
      if (local_360 != OLD) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_780);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_780,
                   (char (*) [16])0x824af3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_780,
                   (char (*) [22])0x824b09);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_780,
                   (char (*) [22])0x824b25);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_780,
                   (char (*) [22])0x824b41);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_780,
                   (char (*) [22])0x824b5d);
        std::operator+(&local_7a0,p,"_VERSION");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_780,&local_7a0);
        std::__cxx11::string::~string((string *)&local_7a0);
        std::operator+(&local_7c0,p,"_VERSION_MAJOR");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_780,&local_7c0);
        std::__cxx11::string::~string((string *)&local_7c0);
        std::operator+(&local_7e0,p,"_VERSION_MINOR");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_780,&local_7e0);
        std::__cxx11::string::~string((string *)&local_7e0);
        std::operator+(&local_800,p,"_VERSION_PATCH");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_780,&local_800);
        std::__cxx11::string::~string((string *)&local_800);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&vw.field_2 + 8),p,"_VERSION_TWEAK");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_780,(value_type *)((long)&vw.field_2 + 8));
        std::__cxx11::string::~string((string *)(vw.field_2._M_local_buf + 8));
        bVar2 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
        if (bVar2) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[22]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_780,
                     (char (*) [22])"CMAKE_PROJECT_VERSION");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_780,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MAJOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_780,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MINOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_780,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_PATCH");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_780,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_TWEAK");
        }
        std::__cxx11::string::string((string *)&__range3);
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_780);
        i_2 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_780);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&i_2), bVar2) {
          name = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
          pcVar3 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
          if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
            if (local_360 == WARN) {
              if ((version.field_2._M_local_buf[10] & 1U) == 0) {
                std::__cxx11::string::operator+=((string *)&__range3,"\n  ");
                std::__cxx11::string::operator+=((string *)&__range3,(string *)name);
              }
            }
            else {
              cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,"");
            }
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9e0);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_a00,(cmPolicies *)0x30,id);
          poVar8 = std::operator<<((ostream *)local_9e0,(string *)&local_a00);
          poVar8 = std::operator<<(poVar8,"\nThe following variable(s) would be set to empty:");
          std::operator<<(poVar8,(string *)&__range3);
          std::__cxx11::string::~string((string *)&local_a00);
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_a20);
          std::__cxx11::string::~string((string *)&local_a20);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9e0);
        }
        std::__cxx11::string::~string((string *)&__range3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_780);
      }
LAB_002765e1:
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a40,"PROJECT_DESCRIPTION",&local_a41);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,&local_a40,pcVar3);
      std::__cxx11::string::~string((string *)&local_a40);
      std::allocator<char>::~allocator(&local_a41);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::operator+(&local_a68,p,"_DESCRIPTION");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,&local_a68,pcVar3);
      std::__cxx11::string::~string((string *)&local_a68);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_DESCRIPTION",pcVar3);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a88,"PROJECT_HOMEPAGE_URL",&local_a89);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,&local_a88,pcVar3);
      std::__cxx11::string::~string((string *)&local_a88);
      std::allocator<char>::~allocator(&local_a89);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::operator+(&local_ab0,p,"_HOMEPAGE_URL");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,&local_ab0,pcVar3);
      std::__cxx11::string::~string((string *)&local_ab0);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_HOMEPAGE_URL",pcVar3);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&missedValueReporter._M_invoker);
      if (bVar2) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &missedValueReporter._M_invoker,(char (*) [2])0x817ac7);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[4]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &missedValueReporter._M_invoker,(char (*) [4])0x834abc);
      }
      cmMakefile::EnableLanguage
                ((this->super_cmCommand).Makefile,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&missedValueReporter._M_invoker,false);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ad0,"CMAKE_PROJECT_INCLUDE",&local_ad1);
      bVar2 = IncludeByVariable(this,&local_ad0);
      std::__cxx11::string::~string((string *)&local_ad0);
      std::allocator<char>::~allocator(&local_ad1);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        std::operator+(&local_b18,"CMAKE_PROJECT_",p);
        std::operator+(&local_af8,&local_b18,"_INCLUDE");
        bVar2 = IncludeByVariable(this,&local_af8);
        std::__cxx11::string::~string((string *)&local_af8);
        std::__cxx11::string::~string((string *)&local_b18);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          this_local._7_1_ = 1;
          msg.field_2._8_4_ = 1;
        }
        else {
          this_local._7_1_ = 0;
          msg.field_2._8_4_ = 1;
        }
      }
      else {
        this_local._7_1_ = 0;
        msg.field_2._8_4_ = 1;
      }
    }
    else if ((local_360 == OLD) || (local_360 == WARN)) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,"VERSION not allowed unless CMP0048 is set to NEW",
                 (allocator<char> *)&vx.field_0xcf);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator((allocator<char> *)&vx.field_0xcf);
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = 1;
      msg.field_2._8_4_ = 1;
    }
    else {
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)((long)&e.field_2 + 8),
                 "^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)((long)&e.field_2 + 8),
                         (string *)((long)&description.field_2 + 8));
      if (bVar2) {
        std::__cxx11::string::string((string *)&sep);
        local_4c0 = "";
        memset(&i_1,0,0x10);
        uVar6 = std::__cxx11::string::c_str();
        vv.field_2._12_4_ = __isoc99_sscanf(uVar6,"%u.%u.%u.%u",&i_1,&vc,v,v + 1);
        for (vv.field_2._8_4_ = 0; (int)vv.field_2._8_4_ < 4;
            vv.field_2._8_4_ = vv.field_2._8_4_ + 1) {
          if ((int)vv.field_2._8_4_ < (int)vv.field_2._12_4_) {
            sprintf(vb[(long)(int)vv.field_2._8_4_ + -1] + 0x38,"%u",
                    (ulong)(uint)(&i_1)[(int)vv.field_2._8_4_]);
            std::__cxx11::string::operator+=((string *)&sep,local_4c0);
            std::__cxx11::string::operator+=
                      ((string *)&sep,vb[(long)(int)vv.field_2._8_4_ + -1] + 0x38);
            local_4c0 = ".";
          }
          else {
            vb[(long)(int)vv.field_2._8_4_ + -1][0x38] = '\0';
          }
        }
        std::__cxx11::string::string((string *)local_600);
        std::operator+(&local_620,p,"_VERSION");
        std::__cxx11::string::operator=((string *)local_600,(string *)&local_620);
        std::__cxx11::string::~string((string *)&local_620);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_640,"PROJECT_VERSION",&local_641);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,&local_640,pcVar3);
        std::__cxx11::string::~string((string *)&local_640);
        std::allocator<char>::~allocator(&local_641);
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)local_600,pcVar3);
        std::operator+(&local_668,p,"_VERSION_MAJOR");
        std::__cxx11::string::operator=((string *)local_600,(string *)&local_668);
        std::__cxx11::string::~string((string *)&local_668);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_688,"PROJECT_VERSION_MAJOR",&local_689);
        cmMakefile::AddDefinition(pcVar1,&local_688,(char *)(v + 2));
        std::__cxx11::string::~string((string *)&local_688);
        std::allocator<char>::~allocator(&local_689);
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,(string *)local_600,(char *)(v + 2));
        std::operator+(&local_6b0,p,"_VERSION_MINOR");
        std::__cxx11::string::operator=((string *)local_600,(string *)&local_6b0);
        std::__cxx11::string::~string((string *)&local_6b0);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6d0,"PROJECT_VERSION_MINOR",&local_6d1);
        cmMakefile::AddDefinition(pcVar1,&local_6d0,vb[0] + 0x38);
        std::__cxx11::string::~string((string *)&local_6d0);
        std::allocator<char>::~allocator(&local_6d1);
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_600,vb[0] + 0x38)
        ;
        std::operator+(&local_6f8,p,"_VERSION_PATCH");
        std::__cxx11::string::operator=((string *)local_600,(string *)&local_6f8);
        std::__cxx11::string::~string((string *)&local_6f8);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_718,"PROJECT_VERSION_PATCH",&local_719);
        cmMakefile::AddDefinition(pcVar1,&local_718,vb[1] + 0x38);
        std::__cxx11::string::~string((string *)&local_718);
        std::allocator<char>::~allocator(&local_719);
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_600,vb[1] + 0x38)
        ;
        std::operator+(&local_740,p,"_VERSION_TWEAK");
        std::__cxx11::string::operator=((string *)local_600,(string *)&local_740);
        std::__cxx11::string::~string((string *)&local_740);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_760,"PROJECT_VERSION_TWEAK",
                   (allocator<char> *)
                   ((long)&vv_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmMakefile::AddDefinition(pcVar1,&local_760,vb[2] + 0x38);
        std::__cxx11::string::~string((string *)&local_760);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&vv_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_600,vb[2] + 0x38)
        ;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION",pcVar3);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_MAJOR",(char *)(v + 2));
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_MINOR",vb[0] + 0x38);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_PATCH",vb[1] + 0x38);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_TWEAK",vb[2] + 0x38);
        std::__cxx11::string::~string((string *)local_600);
        std::__cxx11::string::~string((string *)&sep);
        msg.field_2._8_4_ = 0;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&vs.field_2 + 8),"VERSION \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&description.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_478,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&vs.field_2 + 8),"\" format invalid.");
        std::__cxx11::string::~string((string *)(vs.field_2._M_local_buf + 8));
        cmMakefile::IssueMessage((this->super_cmCommand).Makefile,FATAL_ERROR,(string *)local_478);
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = 1;
        msg.field_2._8_4_ = 1;
        std::__cxx11::string::~string((string *)local_478);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&e.field_2 + 8));
      if (msg.field_2._8_4_ == 0) goto LAB_002765e1;
    }
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmp0048,
               "project with VERSION, DESCRIPTION or HOMEPAGE_URL must use LANGUAGES before language names."
               ,&local_359);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&cmp0048);
    std::__cxx11::string::~string((string *)&cmp0048);
    std::allocator<char>::~allocator(&local_359);
    cmSystemTools::SetFatalErrorOccured();
    this_local._7_1_ = 1;
    msg.field_2._8_4_ = 1;
  }
LAB_00276a83:
  std::function<void_()>::~function((function<void_()> *)&resetReporter);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&missedValueReporter._M_invoker);
  std::__cxx11::string::~string
            ((string *)
             &languages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(homepage.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)(srcdir.field_2._M_local_buf + 8));
LAB_00276b2f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmProjectCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("PROJECT called with incorrect number of arguments");
    return false;
  }

  if (!this->IncludeByVariable("CMAKE_PROJECT_INCLUDE_BEFORE")) {
    return false;
  }

  std::string const& projectName = args[0];

  this->Makefile->SetProjectName(projectName);

  std::string bindir = projectName;
  bindir += "_BINARY_DIR";
  std::string srcdir = projectName;
  srcdir += "_SOURCE_DIR";

  this->Makefile->AddCacheDefinition(
    bindir, this->Makefile->GetCurrentBinaryDirectory().c_str(),
    "Value Computed by CMake", cmStateEnums::STATIC);
  this->Makefile->AddCacheDefinition(
    srcdir, this->Makefile->GetCurrentSourceDirectory().c_str(),
    "Value Computed by CMake", cmStateEnums::STATIC);

  bindir = "PROJECT_BINARY_DIR";
  srcdir = "PROJECT_SOURCE_DIR";

  this->Makefile->AddDefinition(
    bindir, this->Makefile->GetCurrentBinaryDirectory().c_str());
  this->Makefile->AddDefinition(
    srcdir, this->Makefile->GetCurrentSourceDirectory().c_str());

  this->Makefile->AddDefinition("PROJECT_NAME", projectName.c_str());

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if (!this->Makefile->GetDefinition("CMAKE_PROJECT_NAME") ||
      (this->Makefile->IsRootMakefile())) {
    this->Makefile->AddDefinition("CMAKE_PROJECT_NAME", projectName.c_str());
    this->Makefile->AddCacheDefinition(
      "CMAKE_PROJECT_NAME", projectName.c_str(), "Value Computed by CMake",
      cmStateEnums::STATIC);
  }

  bool haveVersion = false;
  bool haveLanguages = false;
  bool haveDescription = false;
  bool haveHomepage = false;
  bool injectedProjectCommand = false;
  std::string version;
  std::string description;
  std::string homepage;
  std::vector<std::string> languages;
  std::function<void()> missedValueReporter;
  auto resetReporter = [&missedValueReporter]() {
    missedValueReporter = std::function<void()>();
  };
  enum Doing
  {
    DoingDescription,
    DoingHomepage,
    DoingLanguages,
    DoingVersion
  };
  Doing doing = DoingLanguages;
  for (size_t i = 1; i < args.size(); ++i) {
    if (args[i] == "LANGUAGES") {
      if (haveLanguages) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveLanguages = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingLanguages;
      if (!languages.empty()) {
        std::string msg =
          "the following parameters must be specified after LANGUAGES "
          "keyword: ";
        msg += cmJoin(languages, ", ");
        msg += '.';
        this->Makefile->IssueMessage(MessageType::WARNING, msg);
      }
    } else if (args[i] == "VERSION") {
      if (haveVersion) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                     "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveVersion = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingVersion;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "VERSION keyword not followed by a value or was followed by a "
          "value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "DESCRIPTION") {
      if (haveDescription) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "DESCRIPTION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveDescription = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingDescription;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "DESCRIPTION keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "HOMEPAGE_URL") {
      if (haveHomepage) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "HOMEPAGE_URL may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveHomepage = true;
      doing = DoingHomepage;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "HOMEPAGE_URL keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (i == 1 && args[i] == "__CMAKE_INJECTED_PROJECT_COMMAND__") {
      injectedProjectCommand = true;
    } else if (doing == DoingVersion) {
      doing = DoingLanguages;
      version = args[i];
      resetReporter();
    } else if (doing == DoingDescription) {
      doing = DoingLanguages;
      description = args[i];
      resetReporter();
    } else if (doing == DoingHomepage) {
      doing = DoingLanguages;
      homepage = args[i];
      resetReporter();
    } else // doing == DoingLanguages
    {
      languages.push_back(args[i]);
    }
  }

  if (missedValueReporter) {
    missedValueReporter();
  }

  if ((haveVersion || haveDescription || haveHomepage) && !haveLanguages &&
      !languages.empty()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "project with VERSION, DESCRIPTION or HOMEPAGE_URL must "
      "use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
  }
  if (haveLanguages && languages.empty()) {
    languages.emplace_back("NONE");
  }

  cmPolicies::PolicyStatus cmp0048 =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion) {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD || cmp0048 == cmPolicies::WARN) {
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }

    cmsys::RegularExpression vx(
      R"(^([0-9]+(\.[0-9]+(\.[0-9]+(\.[0-9]+)?)?)?)?$)");
    if (!vx.find(version)) {
      std::string e = "VERSION \"" + version + "\" format invalid.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }

    std::string vs;
    const char* sep = "";
    char vb[4][64];
    unsigned int v[4] = { 0, 0, 0, 0 };
    int vc =
      sscanf(version.c_str(), "%u.%u.%u.%u", &v[0], &v[1], &v[2], &v[3]);
    for (int i = 0; i < 4; ++i) {
      if (i < vc) {
        sprintf(vb[i], "%u", v[i]);
        vs += sep;
        vs += vb[i];
        sep = ".";
      } else {
        vb[i][0] = 0;
      }
    }

    std::string vv;
    vv = projectName + "_VERSION";
    this->Makefile->AddDefinition("PROJECT_VERSION", vs.c_str());
    this->Makefile->AddDefinition(vv, vs.c_str());
    vv = projectName + "_VERSION_MAJOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MAJOR", vb[0]);
    this->Makefile->AddDefinition(vv, vb[0]);
    vv = projectName + "_VERSION_MINOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MINOR", vb[1]);
    this->Makefile->AddDefinition(vv, vb[1]);
    vv = projectName + "_VERSION_PATCH";
    this->Makefile->AddDefinition("PROJECT_VERSION_PATCH", vb[2]);
    this->Makefile->AddDefinition(vv, vb[2]);
    vv = projectName + "_VERSION_TWEAK";
    this->Makefile->AddDefinition("PROJECT_VERSION_TWEAK", vb[3]);
    this->Makefile->AddDefinition(vv, vb[3]);
    // Also, try set top level variables
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION", vs.c_str());
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_MAJOR", vb[0]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_MINOR", vb[1]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_PATCH", vb[2]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_TWEAK", vb[3]);
  } else if (cmp0048 != cmPolicies::OLD) {
    // Set project VERSION variables to empty
    std::vector<std::string> vv;
    vv.emplace_back("PROJECT_VERSION");
    vv.emplace_back("PROJECT_VERSION_MAJOR");
    vv.emplace_back("PROJECT_VERSION_MINOR");
    vv.emplace_back("PROJECT_VERSION_PATCH");
    vv.emplace_back("PROJECT_VERSION_TWEAK");
    vv.push_back(projectName + "_VERSION");
    vv.push_back(projectName + "_VERSION_MAJOR");
    vv.push_back(projectName + "_VERSION_MINOR");
    vv.push_back(projectName + "_VERSION_PATCH");
    vv.push_back(projectName + "_VERSION_TWEAK");
    if (this->Makefile->IsRootMakefile()) {
      vv.emplace_back("CMAKE_PROJECT_VERSION");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MAJOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MINOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_PATCH");
      vv.emplace_back("CMAKE_PROJECT_VERSION_TWEAK");
    }
    std::string vw;
    for (std::string const& i : vv) {
      const char* v = this->Makefile->GetDefinition(i);
      if (v && *v) {
        if (cmp0048 == cmPolicies::WARN) {
          if (!injectedProjectCommand) {
            vw += "\n  ";
            vw += i;
          }
        } else {
          this->Makefile->AddDefinition(i, "");
        }
      }
    }
    if (!vw.empty()) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0048)
        << "\nThe following variable(s) would be set to empty:" << vw;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    }
  }

  this->Makefile->AddDefinition("PROJECT_DESCRIPTION", description.c_str());
  this->Makefile->AddDefinition(projectName + "_DESCRIPTION",
                                description.c_str());
  TopLevelCMakeVarCondSet("CMAKE_PROJECT_DESCRIPTION", description.c_str());

  this->Makefile->AddDefinition("PROJECT_HOMEPAGE_URL", homepage.c_str());
  this->Makefile->AddDefinition(projectName + "_HOMEPAGE_URL",
                                homepage.c_str());
  TopLevelCMakeVarCondSet("CMAKE_PROJECT_HOMEPAGE_URL", homepage.c_str());

  if (languages.empty()) {
    // if no language is specified do c and c++
    languages.emplace_back("C");
    languages.emplace_back("CXX");
  }
  this->Makefile->EnableLanguage(languages, false);

  if (!this->IncludeByVariable("CMAKE_PROJECT_INCLUDE")) {
    return false;
  }

  if (!this->IncludeByVariable("CMAKE_PROJECT_" + projectName + "_INCLUDE")) {
    return false;
  }

  return true;
}